

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
* __thiscall
vkt::shaderexecutor::
generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *__return_storage_ptr__,shaderexecutor *this,
          Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,deUint32 seed
          )

{
  iterator iVar1;
  undefined4 uVar2;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *pSVar3;
  void *pvVar4;
  void *pvVar5;
  const_iterator cVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  undefined4 in_register_00000084;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *pvVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  shaderexecutor *psVar19;
  bool bVar20;
  In3 in3;
  In2 in2;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  fixedInputs;
  InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  tuple;
  In1 in1;
  In0 in0;
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  seenInputs;
  Random rnd;
  Void local_15a;
  Void local_159;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_158;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_150;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_148;
  undefined4 local_13c;
  void *local_138;
  void *pvStack_130;
  long local_128;
  void *pvStack_120;
  void *local_118;
  long lStack_110;
  void *local_108;
  void *pvStack_100;
  long local_f8;
  void *pvStack_f0;
  void *local_e8;
  long lStack_e0;
  undefined1 local_d0 [25];
  Void local_b7 [7];
  long local_b0;
  shaderexecutor *local_a8;
  value_type local_a0;
  value_type local_94;
  ulong local_88;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_80;
  ulong local_78;
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  local_70;
  deRandom local_40;
  
  local_b0 = CONCAT44(in_register_00000084,intPrecision);
  deRandom_init(&local_40,(deUint32)numSamples);
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8 = (void *)0x0;
  lStack_e0 = 0;
  local_f8 = 0;
  pvStack_f0 = (void *)0x0;
  local_108 = (void *)0x0;
  pvStack_100 = (void *)0x0;
  local_118 = (void *)0x0;
  lStack_110 = 0;
  local_128 = 0;
  pvStack_120 = (void *)0x0;
  local_138 = (void *)0x0;
  pvStack_130 = (void *)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_120);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_108);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_f0);
  local_13c = SUB84(floatFormat,0);
  local_a8 = this;
  local_80 = samplings;
  if (pvStack_130 != local_138) {
    local_148 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_150 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    lVar18 = 0;
    uVar16 = 0;
    pvVar5 = pvStack_120;
    pvVar8 = local_118;
    pvVar4 = local_138;
    pvVar7 = pvStack_130;
    pvVar13 = local_118;
    do {
      bVar20 = pvVar13 != pvVar5;
      pvVar13 = pvVar5;
      if (bVar20) {
        lVar17 = 0;
        uVar15 = 0;
        pvVar10 = local_108;
        pvVar11 = pvStack_100;
        pvVar12 = pvStack_100;
        local_88 = uVar16;
        do {
          bVar20 = pvVar12 != pvVar10;
          pvVar12 = pvVar10;
          if (bVar20) {
            pvVar14 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *
                      )0x0;
            pvVar4 = pvStack_f0;
            pvVar7 = local_e8;
            local_78 = uVar15;
            do {
              bVar20 = pvVar7 != pvVar4;
              pvVar7 = pvVar4;
              if (bVar20) {
                uVar16 = 0;
                local_158 = pvVar14;
                do {
                  lVar9 = 0;
                  do {
                    *(undefined4 *)(local_d0 + lVar9 * 4) =
                         *(undefined4 *)((long)local_138 + lVar9 * 4 + lVar18);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  lVar9 = 0;
                  do {
                    *(undefined4 *)(local_d0 + lVar9 * 4 + 0xc) =
                         *(undefined4 *)((long)pvStack_120 + lVar9 * 4 + lVar17);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  std::
                  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                  ::
                  _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                            ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                              *)&local_70,
                             (InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                              *)local_d0);
                  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  push_back(&__return_storage_ptr__->in0,(value_type *)local_d0);
                  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  push_back(&__return_storage_ptr__->in1,(value_type *)(local_d0 + 0xc));
                  iVar1._M_current =
                       (__return_storage_ptr__->in2).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in2).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>
                              (local_148,iVar1,(Void *)(local_d0 + 0x18));
                  }
                  else {
                    (__return_storage_ptr__->in2).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar1._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_150,iVar1,local_b7);
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  uVar16 = uVar16 + 1;
                  pvVar4 = pvStack_f0;
                  pvVar7 = local_e8;
                  pvVar10 = local_108;
                  pvVar11 = pvStack_100;
                  pvVar14 = local_158;
                  uVar15 = local_78;
                } while (uVar16 < (ulong)((long)local_e8 - (long)pvStack_f0));
              }
              pvVar14 = pvVar14 + 1;
              pvVar5 = pvStack_120;
              pvVar8 = local_118;
              pvVar12 = pvVar11;
            } while (pvVar14 < (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                                *)((long)pvVar11 - (long)pvVar10));
          }
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 0xc;
          pvVar4 = local_138;
          pvVar7 = pvStack_130;
          pvVar13 = pvVar8;
          uVar16 = local_88;
        } while (uVar15 < (ulong)(((long)pvVar8 - (long)pvVar5 >> 2) * -0x5555555555555555));
      }
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0xc;
    } while (uVar16 < (ulong)(((long)pvVar7 - (long)pvVar4 >> 2) * -0x5555555555555555));
  }
  pSVar3 = local_80;
  uVar2 = local_13c;
  if (local_b0 != 0) {
    local_148 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in1;
    local_150 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_158 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    psVar19 = local_a8;
    do {
      (**(code **)(**(long **)psVar19 + 8))(&local_94,*(long **)psVar19,pSVar3,uVar2,&local_40);
      (**(code **)(**(long **)(psVar19 + 8) + 8))
                (&local_a0,*(long **)(psVar19 + 8),pSVar3,uVar2,&local_40);
      (**(code **)(**(long **)(psVar19 + 0x10) + 8))
                (*(long **)(psVar19 + 0x10),pSVar3,uVar2,&local_40);
      (**(code **)(**(long **)(psVar19 + 0x18) + 8))
                (*(long **)(psVar19 + 0x18),pSVar3,uVar2,&local_40);
      local_d0._8_4_ = local_94.m_data[2];
      local_d0._0_4_ = local_94.m_data[0];
      local_d0._4_4_ = local_94.m_data[1];
      local_d0._20_4_ = local_a0.m_data[2];
      local_d0._12_4_ = local_a0.m_data[0];
      local_d0._16_4_ = local_a0.m_data[1];
      cVar6 = std::
              _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
              ::find(&local_70,(key_type *)local_d0);
      psVar19 = local_a8;
      if ((_Rb_tree_header *)cVar6._M_node == &local_70._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
        ::
        _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                  ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                    *)&local_70,
                   (InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                    *)local_d0);
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  (&__return_storage_ptr__->in0,&local_94);
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   local_148,&local_a0);
        iVar1._M_current =
             (__return_storage_ptr__->in2).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in2).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_150,iVar1,&local_159);
        }
        else {
          (__return_storage_ptr__->in2).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_158,iVar1,&local_15a);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      local_b0 = local_b0 + -1;
    } while (local_b0 != 0);
  }
  std::
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  ::~_Rb_tree(&local_70);
  if (pvStack_f0 != (void *)0x0) {
    operator_delete(pvStack_f0,lStack_e0 - (long)pvStack_f0);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  if (pvStack_120 != (void *)0x0) {
    operator_delete(pvStack_120,lStack_110 - (long)pvStack_120);
  }
  if (local_138 != (void *)0x0) {
    operator_delete(local_138,local_128 - (long)local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   deUint32				seed)
{
	Random										rnd(seed);
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}